

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  uint64_t *puVar1;
  st_ptls_aead_context_t *psVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  uint32_t uVar7;
  uint8_t uVar8;
  uint uVar9;
  uint uVar10;
  code *cb;
  st_ptls_record_t local_50;
  undefined2 local_35;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  iVar4 = parse_record(tls,&local_50,(uint8_t *)input,inlen);
  puVar3 = local_50.fragment;
  sVar6 = local_50.length;
  if (iVar4 != 0) {
    return iVar4;
  }
  if (local_50.fragment == (uint8_t *)0x0) {
    __assert_fail("rec.fragment != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x16ed,
                  "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  if (local_50.type == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if (local_50.length != 1) {
      return 0x2f;
    }
    uVar10 = 0x202;
    if (*local_50.fragment != '\x01') {
      return 0x2f;
    }
    goto LAB_00111ef0;
  }
  iVar4 = (int)local_50.length;
  if ((local_50.type == '\x15') ||
     ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
    uVar8 = local_50.type;
    if ((local_50.type == '\x17') &&
       ((uVar8 = '\x17', (tls->field_0x1e8 & 1) != 0 &&
        (uVar7 = (tls->field_19).server.early_data_skipped_bytes, uVar7 != 0xffffffff))))
    goto LAB_00111e73;
  }
  else {
    if (local_50.type != '\x17') {
      return 0x28;
    }
    iVar5 = ptls_buffer_reserve(decryptbuf,local_50.length + 5);
    if (iVar5 != 0) {
      return iVar5;
    }
    local_35 = 0x317;
    local_33 = 3;
    local_32 = (undefined1)(sVar6 >> 8);
    local_31 = (undefined1)sVar6;
    psVar2 = (tls->traffic_protection).dec.aead;
    sVar6 = (*psVar2->do_decrypt)
                      (psVar2,decryptbuf->base + decryptbuf->off,puVar3,sVar6,
                       (tls->traffic_protection).dec.seq,&local_35,5);
    if (sVar6 == 0xffffffffffffffff) {
      if ((tls->field_0x1e8 & 1) == 0) {
        return 0x14;
      }
      uVar7 = (tls->field_19).server.early_data_skipped_bytes;
      if (uVar7 == 0xffffffff) {
        return 0x14;
      }
LAB_00111e73:
      uVar9 = iVar4 + uVar7;
      (tls->field_19).server.early_data_skipped_bytes = uVar9;
      uVar10 = 0x202;
      if (0x10000 < uVar9) {
        return 0x28;
      }
      goto LAB_00111ef0;
    }
    puVar1 = &(tls->traffic_protection).dec.seq;
    *puVar1 = *puVar1 + 1;
    local_50.fragment = decryptbuf->base + decryptbuf->off;
    do {
      local_50.length = sVar6 - 1;
      if (sVar6 == 0) {
        return 10;
      }
      uVar8 = local_50.fragment[sVar6 - 1];
      sVar6 = local_50.length;
      local_50.type = uVar8;
    } while (uVar8 == '\0');
  }
  if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (uVar8 != '\x16')) {
    if (uVar8 == '\x15') {
      if (local_50.length == 2) {
        uVar10 = local_50.fragment[1] | 0x100;
      }
      else {
        uVar10 = 0x32;
      }
    }
    else {
      uVar10 = 10;
      if (uVar8 == '\x17') {
        if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
          if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
             (uVar10 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
            decryptbuf->off = decryptbuf->off + local_50.length;
          }
        }
        else {
          decryptbuf->off = decryptbuf->off + local_50.length;
          uVar10 = 0;
        }
      }
    }
  }
  else {
    cb = handle_server_handshake_message;
    if ((tls->field_0x1e8 & 1) == 0) {
      cb = handle_client_handshake_message;
    }
    uVar10 = handle_handshake_record(tls,cb,emitter,&local_50,properties);
  }
LAB_00111ef0:
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  return uVar10;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}